

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O2

int test_nanoftp(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  void *pvVar10;
  char *pcVar11;
  uint uVar12;
  int n_ctx_1;
  uint uVar13;
  ulong uVar14;
  int test_ret_6;
  undefined8 *puVar15;
  char *in_RSI;
  int n_ctx_2;
  undefined8 uVar16;
  undefined8 uVar17;
  int test_ret_3;
  int n_ctx;
  uint uVar18;
  undefined8 uVar19;
  int local_64;
  int test_ret;
  int local_58;
  int test_ret_4;
  int test_ret_1;
  
  if (quiet == '\0') {
    puts("Testing nanoftp : 14 of 22 functions ...");
  }
  test_ret = 0;
  for (uVar18 = 0; uVar18 != 4; uVar18 = uVar18 + 1) {
    iVar1 = xmlMemBlocks();
    pvVar10 = gen_xmlNanoFTPCtxtPtr(uVar18,(int)in_RSI);
    xmlNanoFTPCheckResponse();
    call_tests = call_tests + 1;
    if (pvVar10 != (void *)0x0) {
      xmlNanoFTPFreeCtxt();
    }
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar1 != iVar2) {
      iVar2 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNanoFTPCheckResponse",(ulong)(uint)(iVar2 - iVar1));
      test_ret = test_ret + 1;
      in_RSI = (char *)(ulong)uVar18;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  iVar1 = xmlMemBlocks();
  xmlNanoFTPCleanup();
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar2 = xmlMemBlocks();
  if (iVar1 != iVar2) {
    iVar3 = xmlMemBlocks();
    in_RSI = (char *)(ulong)(uint)(iVar3 - iVar1);
    printf("Leak of %d blocks found in xmlNanoFTPCleanup");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar3 = 0;
  pcVar11 = (char *)0x0;
  while (iVar6 = (int)pcVar11, iVar6 != 4) {
    iVar4 = xmlMemBlocks();
    pvVar10 = gen_xmlNanoFTPCtxtPtr(iVar6,(int)in_RSI);
    xmlNanoFTPCloseConnection();
    call_tests = call_tests + 1;
    if (pvVar10 != (void *)0x0) {
      xmlNanoFTPFreeCtxt();
    }
    xmlResetLastError();
    iVar5 = xmlMemBlocks();
    if (iVar4 != iVar5) {
      iVar5 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNanoFTPCloseConnection",(ulong)(uint)(iVar5 - iVar4));
      iVar3 = iVar3 + 1;
      printf(" %d");
      putchar(10);
      in_RSI = pcVar11;
    }
    pcVar11 = (char *)(ulong)(iVar6 + 1);
  }
  function_tests = function_tests + 1;
  local_64 = 0;
  for (uVar18 = 0; uVar18 != 4; uVar18 = uVar18 + 1) {
    pcVar11 = (char *)0x0;
    puVar15 = &DAT_00167d78;
    while( true ) {
      iVar6 = (int)in_RSI;
      uVar9 = (uint)pcVar11;
      if (uVar9 == 4) break;
      iVar4 = xmlMemBlocks();
      pvVar10 = gen_xmlNanoFTPCtxtPtr(uVar18,iVar6);
      if (uVar9 < 3) {
        in_RSI = (char *)*puVar15;
      }
      else {
        in_RSI = (char *)0x0;
      }
      xmlNanoFTPCwd();
      call_tests = call_tests + 1;
      if (pvVar10 != (void *)0x0) {
        xmlNanoFTPFreeCtxt();
      }
      xmlResetLastError();
      iVar6 = xmlMemBlocks();
      if (iVar4 != iVar6) {
        iVar6 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNanoFTPCwd",(ulong)(uint)(iVar6 - iVar4));
        local_64 = local_64 + 1;
        printf(" %d",(ulong)uVar18);
        printf(" %d");
        putchar(10);
        in_RSI = pcVar11;
      }
      pcVar11 = (char *)(ulong)(uVar9 + 1);
      puVar15 = puVar15 + 1;
    }
  }
  function_tests = function_tests + 1;
  iVar6 = 0;
  uVar14 = 0;
  while (iVar4 = (int)uVar14, iVar4 != 4) {
    pcVar11 = (char *)0x0;
    while( true ) {
      iVar8 = (int)in_RSI;
      iVar5 = (int)pcVar11;
      if (iVar5 == 8) break;
      iVar7 = xmlMemBlocks();
      pvVar10 = gen_xmlNanoFTPCtxtPtr(iVar4,iVar8);
      in_RSI = gen_filepath(iVar5,iVar8);
      xmlNanoFTPDele();
      call_tests = call_tests + 1;
      if (pvVar10 != (void *)0x0) {
        xmlNanoFTPFreeCtxt();
      }
      xmlResetLastError();
      iVar8 = xmlMemBlocks();
      if (iVar7 != iVar8) {
        iVar8 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNanoFTPDele",(ulong)(uint)(iVar8 - iVar7));
        iVar6 = iVar6 + 1;
        printf(" %d",uVar14);
        printf(" %d");
        putchar(10);
        in_RSI = pcVar11;
      }
      pcVar11 = (char *)(ulong)(iVar5 + 1);
    }
    uVar14 = (ulong)(iVar4 + 1);
  }
  function_tests = function_tests + 1;
  iVar4 = 0;
  for (uVar18 = 0; uVar18 != 4; uVar18 = uVar18 + 1) {
    iVar5 = xmlMemBlocks();
    pvVar10 = gen_xmlNanoFTPCtxtPtr(uVar18,(int)in_RSI);
    xmlNanoFTPGetResponse();
    call_tests = call_tests + 1;
    if (pvVar10 != (void *)0x0) {
      xmlNanoFTPFreeCtxt();
    }
    xmlResetLastError();
    iVar8 = xmlMemBlocks();
    if (iVar5 != iVar8) {
      iVar8 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNanoFTPGetResponse",(ulong)(uint)(iVar8 - iVar5));
      iVar4 = iVar4 + 1;
      in_RSI = (char *)(ulong)uVar18;
      printf(" %d");
      putchar(10);
    }
  }
  iVar1 = (uint)(iVar1 != iVar2) + test_ret + iVar3 + local_64;
  function_tests = function_tests + 1;
  iVar2 = xmlMemBlocks();
  xmlNanoFTPInit();
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar3 = xmlMemBlocks();
  if (iVar2 != iVar3) {
    iVar5 = xmlMemBlocks();
    in_RSI = (char *)(ulong)(uint)(iVar5 - iVar2);
    printf("Leak of %d blocks found in xmlNanoFTPInit");
    putchar(10);
  }
  function_tests = function_tests + 1;
  local_58 = 0;
  for (uVar18 = 0; uVar18 != 8; uVar18 = uVar18 + 1) {
    iVar5 = xmlMemBlocks();
    pcVar11 = gen_filepath(uVar18,(int)in_RSI);
    xmlNanoFTPNewCtxt(pcVar11);
    xmlNanoFTPClose();
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar8 = xmlMemBlocks();
    if (iVar5 != iVar8) {
      iVar8 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNanoFTPNewCtxt",(ulong)(uint)(iVar8 - iVar5));
      local_58 = local_58 + 1;
      in_RSI = (char *)(ulong)uVar18;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  test_ret_4 = 0;
  for (uVar18 = 0; uVar18 != 8; uVar18 = uVar18 + 1) {
    iVar5 = xmlMemBlocks();
    pcVar11 = gen_filepath(uVar18,(int)in_RSI);
    xmlNanoFTPOpen(pcVar11);
    xmlNanoFTPClose();
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar8 = xmlMemBlocks();
    if (iVar5 != iVar8) {
      iVar8 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNanoFTPOpen",(ulong)(uint)(iVar8 - iVar5));
      test_ret_4 = test_ret_4 + 1;
      in_RSI = (char *)(ulong)uVar18;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  for (uVar18 = 0; uVar18 != 4; uVar18 = uVar18 + 1) {
    for (iVar5 = 0; iVar5 != 4; iVar5 = iVar5 + 1) {
      uVar9 = gen_int(iVar5,(int)in_RSI);
      for (uVar12 = 0; uVar12 != 4; uVar12 = uVar12 + 1) {
        uVar14 = 0;
        while (uVar13 = (uint)uVar14, uVar13 != 4) {
          for (iVar8 = 0; iVar8 != 4; iVar8 = iVar8 + 1) {
            if (uVar18 < 3) {
              uVar19 = (&DAT_00167d78)[uVar18];
            }
            else {
              uVar19 = 0;
            }
            if (uVar12 < 3) {
              uVar16 = (&DAT_00167d78)[uVar12];
            }
            else {
              uVar16 = 0;
            }
            if (uVar13 < 3) {
              uVar17 = (&DAT_00167d78)[uVar14];
            }
            else {
              uVar17 = 0;
            }
            iVar7 = gen_int(iVar8,(int)in_RSI);
            in_RSI = (char *)(ulong)uVar9;
            xmlNanoFTPProxy(uVar19,in_RSI,uVar16,uVar17,iVar7);
            call_tests = call_tests + 1;
            xmlResetLastError();
          }
          uVar14 = (ulong)(uVar13 + 1);
        }
      }
    }
  }
  function_tests = function_tests + 1;
  test_ret = 0;
  for (uVar18 = 0; uVar18 != 4; uVar18 = uVar18 + 1) {
    iVar5 = xmlMemBlocks();
    pvVar10 = gen_xmlNanoFTPCtxtPtr(uVar18,(int)in_RSI);
    xmlNanoFTPQuit(pvVar10);
    call_tests = call_tests + 1;
    if (pvVar10 != (void *)0x0) {
      xmlNanoFTPFreeCtxt(pvVar10);
    }
    xmlResetLastError();
    iVar8 = xmlMemBlocks();
    if (iVar5 != iVar8) {
      iVar8 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNanoFTPQuit",(ulong)(uint)(iVar8 - iVar5));
      test_ret = test_ret + 1;
      in_RSI = (char *)(ulong)uVar18;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_64 = 0;
  for (uVar18 = 0; uVar18 != 4; uVar18 = uVar18 + 1) {
    for (uVar14 = 0; (int)uVar14 != 2; uVar14 = (ulong)((int)uVar14 + 1)) {
      pcVar11 = (char *)0x0;
      while( true ) {
        iVar8 = (int)in_RSI;
        iVar5 = (int)pcVar11;
        if (iVar5 == 4) break;
        iVar7 = xmlMemBlocks();
        pvVar10 = gen_xmlNanoFTPCtxtPtr(uVar18,iVar8);
        iVar8 = gen_int(iVar5,iVar8);
        in_RSI = (char *)0x0;
        xmlNanoFTPRead(pvVar10,0,iVar8);
        call_tests = call_tests + 1;
        if (pvVar10 != (void *)0x0) {
          xmlNanoFTPFreeCtxt(pvVar10);
        }
        xmlResetLastError();
        iVar8 = xmlMemBlocks();
        if (iVar7 != iVar8) {
          iVar8 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlNanoFTPRead",(ulong)(uint)(iVar8 - iVar7));
          local_64 = local_64 + 1;
          printf(" %d",(ulong)uVar18);
          printf(" %d",uVar14);
          printf(" %d");
          putchar(10);
          in_RSI = pcVar11;
        }
        pcVar11 = (char *)(ulong)(iVar5 + 1);
      }
    }
  }
  function_tests = function_tests + 1;
  for (iVar5 = 0; iVar5 != 8; iVar5 = iVar5 + 1) {
    pcVar11 = gen_filepath(iVar5,(int)in_RSI);
    xmlNanoFTPScanProxy(pcVar11);
    call_tests = call_tests + 1;
    xmlResetLastError();
  }
  function_tests = function_tests + 1;
  iVar5 = 0;
  for (uVar18 = 0; uVar18 != 4; uVar18 = uVar18 + 1) {
    for (uVar9 = 0; iVar8 = (int)in_RSI, uVar9 != 8; uVar9 = uVar9 + 1) {
      iVar7 = xmlMemBlocks();
      pvVar10 = gen_xmlNanoFTPCtxtPtr(uVar18,iVar8);
      in_RSI = gen_filepath(uVar9,iVar8);
      xmlNanoFTPUpdateURL(pvVar10);
      call_tests = call_tests + 1;
      if (pvVar10 != (void *)0x0) {
        xmlNanoFTPFreeCtxt(pvVar10);
      }
      xmlResetLastError();
      iVar8 = xmlMemBlocks();
      if (iVar7 != iVar8) {
        iVar8 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNanoFTPUpdateURL",(ulong)(uint)(iVar8 - iVar7));
        iVar5 = iVar5 + 1;
        printf(" %d",(ulong)uVar18);
        in_RSI = (char *)(ulong)uVar9;
        printf(" %d");
        putchar(10);
      }
    }
  }
  function_tests = function_tests + 1;
  uVar18 = iVar1 + iVar6 + iVar4 + (uint)(iVar2 != iVar3) + local_58 + test_ret_4 + test_ret +
           local_64 + iVar5;
  if (uVar18 != 0) {
    printf("Module nanoftp: %d errors\n",(ulong)uVar18);
  }
  return uVar18;
}

Assistant:

static int
test_nanoftp(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing nanoftp : 14 of 22 functions ...\n");
    test_ret += test_xmlNanoFTPCheckResponse();
    test_ret += test_xmlNanoFTPCleanup();
    test_ret += test_xmlNanoFTPCloseConnection();
    test_ret += test_xmlNanoFTPCwd();
    test_ret += test_xmlNanoFTPDele();
    test_ret += test_xmlNanoFTPGet();
    test_ret += test_xmlNanoFTPGetConnection();
    test_ret += test_xmlNanoFTPGetResponse();
    test_ret += test_xmlNanoFTPGetSocket();
    test_ret += test_xmlNanoFTPInit();
    test_ret += test_xmlNanoFTPList();
    test_ret += test_xmlNanoFTPNewCtxt();
    test_ret += test_xmlNanoFTPOpen();
    test_ret += test_xmlNanoFTPProxy();
    test_ret += test_xmlNanoFTPQuit();
    test_ret += test_xmlNanoFTPRead();
    test_ret += test_xmlNanoFTPScanProxy();
    test_ret += test_xmlNanoFTPUpdateURL();

    if (test_ret != 0)
	printf("Module nanoftp: %d errors\n", test_ret);
    return(test_ret);
}